

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O2

int case_eq(case_t_conflict el1,case_t_conflict el2,void *arg)

{
  byte *pbVar1;
  byte *pbVar2;
  int iVar3;
  int iVar4;
  
  if ((el1->case_node->code != N_CASE) || (el2->case_node->code != N_CASE)) {
    __assert_fail("el1->case_node->code == N_CASE && el2->case_node->code == N_CASE",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                  ,0x203b,"int case_eq(case_t, case_t, void *)");
  }
  pbVar1 = (byte *)((el1->case_node->u).ops.head)->attr;
  if (((*pbVar1 & 1) != 0) &&
     (pbVar2 = (byte *)((el2->case_node->u).ops.head)->attr, (*pbVar2 & 1) != 0)) {
    iVar3 = signed_integer_type_p(*(type **)(pbVar1 + 0x18));
    iVar4 = signed_integer_type_p(*(type **)(pbVar2 + 0x18));
    if (iVar3 == iVar4) {
      signed_integer_type_p(*(type **)(pbVar1 + 0x18));
      return (uint)(*(long *)(pbVar1 + 0x30) == *(long *)(pbVar2 + 0x30));
    }
    __assert_fail("signed_integer_type_p (expr1->type) == signed_integer_type_p (expr2->type)",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                  ,0x203f,"int case_eq(case_t, case_t, void *)");
  }
  __assert_fail("expr1->const_p && expr2->const_p",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                ,0x203e,"int case_eq(case_t, case_t, void *)");
}

Assistant:

static int case_eq (case_t el1, case_t el2, void *arg MIR_UNUSED) {
  node_t case_expr1 = NL_HEAD (el1->case_node->u.ops);
  node_t case_expr2 = NL_HEAD (el2->case_node->u.ops);
  struct expr *expr1, *expr2;

  assert (el1->case_node->code == N_CASE && el2->case_node->code == N_CASE);
  expr1 = case_expr1->attr;
  expr2 = case_expr2->attr;
  assert (expr1->const_p && expr2->const_p);
  assert (signed_integer_type_p (expr1->type) == signed_integer_type_p (expr2->type));
  if (signed_integer_type_p (expr1->type)) return expr1->c.i_val == expr2->c.i_val;
  return expr1->c.u_val == expr2->c.u_val;
}